

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::WindyTexture::ToString_abi_cxx11_(WindyTexture *this)

{
  string *in_RDI;
  TextureMapping3DHandle *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::TextureMapping3DHandle_const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string WindyTexture::ToString() const {
    return StringPrintf("[ WindyTexture mapping: %s ]", mapping);
}